

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolARP.cpp
# Opt level: O1

void __thiscall
ProtocolARP::Add(ProtocolARP *this,uint8_t *protocolAddress,uint8_t *hardwareAddress)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ARPCacheEntry *pAVar5;
  long lVar6;
  uint8_t uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar2 = LocateProtocolAddress(this,protocolAddress);
  pAVar5 = this->Cache;
  if ((int)uVar2 < 0) {
    lVar6 = 0;
    do {
      if (pAVar5->Age == '\0') goto LAB_0010593c;
      lVar6 = lVar6 + 1;
      pAVar5 = pAVar5 + 1;
    } while (lVar6 != 5);
    lVar6 = 5;
LAB_0010593c:
    uVar2 = (uint)lVar6;
    if (uVar2 == 5) {
      lVar6 = 0;
      uVar8 = 1;
      uVar2 = 0;
      do {
        uVar1 = uVar8;
        if (this->Cache[1].IPv4Address[lVar6 + -1] <= this->Cache[(int)uVar2].Age) {
          uVar1 = uVar2;
        }
        uVar2 = uVar1;
        lVar6 = lVar6 + 0xb;
        uVar8 = uVar8 + 1;
      } while (lVar6 != 0x2c);
    }
    this->Cache[uVar2].Age = '\x01';
    sVar4 = ProtocolIPv4::AddressSize(this->IP);
    if (sVar4 != 0) {
      uVar9 = 0;
      do {
        this->Cache[uVar2].IPv4Address[uVar9] = protocolAddress[uVar9];
        uVar9 = uVar9 + 1;
        sVar4 = ProtocolIPv4::AddressSize(this->IP);
      } while (uVar9 < sVar4);
    }
    iVar3 = (*this->MAC->_vptr_InterfaceMAC[3])();
    if (CONCAT44(extraout_var,iVar3) != 0) {
      uVar9 = 0;
      do {
        this->Cache[uVar2].MACAddress[uVar9] = hardwareAddress[uVar9];
        uVar9 = uVar9 + 1;
        iVar3 = (*this->MAC->_vptr_InterfaceMAC[3])();
      } while (uVar9 < CONCAT44(extraout_var_00,iVar3));
    }
  }
  else {
    pAVar5[uVar2].Age = '\x01';
  }
  lVar6 = 0;
  do {
    uVar7 = this->Cache[0].IPv4Address[lVar6 + -1];
    if (uVar7 != '\0') {
      uVar7 = uVar7 + '\x01';
      if (uVar7 == 0xff) {
        uVar7 = '\0';
      }
      this->Cache[0].IPv4Address[lVar6 + -1] = uVar7;
    }
    lVar6 = lVar6 + 0xb;
  } while (lVar6 != 0x37);
  return;
}

Assistant:

void ProtocolARP::Add(const uint8_t* protocolAddress, const uint8_t* hardwareAddress)
{
    int index;
    uint32_t i;
    int oldest;

    index = LocateProtocolAddress(protocolAddress);
    if (index >= 0)
    {
        // Found entry in table, reset it's age
        Cache[index].Age = 1;
    }
    else
    {
        // Not already in table;
        for (i = 0; i < ARPCacheSize; i++)
        {
            if (Cache[i].Age == 0)
            {
                // Entry not used, take it
                break;
            }
        }
        if (i == ARPCacheSize)
        {
            // Table is full, steal the oldest entry
            oldest = 0;
            for (i = 1; i < ARPCacheSize; i++)
            {
                if (Cache[i].Age > Cache[oldest].Age)
                {
                    oldest = i;
                }
            }
            i = oldest;
        }

        // At this point i is the entry we want to use
        Cache[i].Age = 1;
        for (size_t j = 0; j < IP.AddressSize(); j++)
        {
            Cache[i].IPv4Address[j] = protocolAddress[j];
        }
        for (size_t j = 0; j < MAC.AddressSize(); j++)
        {
            Cache[i].MACAddress[j] = hardwareAddress[j];
        }
    }

    // Age the list
    for (i = 0; i < ARPCacheSize; i++)
    {
        if (Cache[i].Age != 0)
        {
            Cache[i].Age++;
            if (Cache[i].Age == 0xFF)
            {
                // Flush this entry
                Cache[i].Age = 0;
            }
        }
    }
}